

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_insert_single_element_Test::VectorSUnitTest_insert_single_element_Test
          (VectorSUnitTest_insert_single_element_Test *this)

{
  VectorSUnitTest_insert_single_element_Test *this_local;
  
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test =
       (_func_int **)&PTR__VectorSUnitTest_insert_single_element_Test_001d0f90;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, insert_single_element)
{
    vector_s<std::string, 10> v{"0","1","2"};
    EXPECT_EQ("0", v[0]);
    EXPECT_EQ("1", v[1]);
    EXPECT_EQ("2", v[2]);
    EXPECT_EQ(3u, v.size());

    const auto it1 = v.insert(v.begin(), "10");
    EXPECT_EQ("10", *it1);
    EXPECT_EQ("10", v[0]);
    EXPECT_EQ("0", v[1]);
    EXPECT_EQ("1", v[2]);
    EXPECT_EQ("2", v[3]);
    EXPECT_EQ(4u, v.size());

    const auto it2 = v.insert(v.begin()+2, "20");
    EXPECT_EQ("20", *it2);
    EXPECT_EQ("10", v[0]);
    EXPECT_EQ("0", v[1]);
    EXPECT_EQ("20", v[2]);
    EXPECT_EQ("1", v[3]);
    EXPECT_EQ("2", v[4]);
    EXPECT_EQ(5u, v.size());

    const auto it3 = v.insert(v.end(), "50");
    EXPECT_EQ("50", *it3);
    EXPECT_EQ("10", v[0]);
    EXPECT_EQ("0", v[1]);
    EXPECT_EQ("20", v[2]);
    EXPECT_EQ("1", v[3]);
    EXPECT_EQ("2", v[4]);
    EXPECT_EQ("50", v[5]);
    EXPECT_EQ(6u, v.size());
}